

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::trimCommandPoolTest
          (TestStatus *__return_storage_ptr__,Context *context,VkCommandBufferLevel cmdBufferLevel)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  VkDevice device;
  DeviceInterface *vk;
  Unique<vk::Handle<(vk::HandleType)10>_> *ptr;
  ulong uVar3;
  NotSupportedError *this;
  ulong uVar4;
  deUint32 bufferNdx;
  long lVar5;
  int iVar6;
  allocator<char> local_121;
  TestStatus *local_120;
  string local_118;
  Context *local_f0;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> cmdBuffersPeak;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> cmdBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  events;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_98;
  long local_78;
  ulong local_70;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_68;
  VkCommandPoolCreateInfo cmdPoolParams;
  
  local_120 = __return_storage_ptr__;
  pvVar2 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_98.m_data.object.m_internal =
       (deUint64)
       (pvVar2->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_118._M_dataplus._M_p =
       (pointer)(pvVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  bVar1 = de::
          contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_98,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_118,(char (*) [20])0x9d0973);
  if (!bVar1) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Extension VK_KHR_maintenance1 not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
               ,0x4cc);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_f0 = context;
  cmdPoolParams.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_118,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  local_98.m_data.deleter.m_device = (VkDevice)local_118.field_2._M_allocated_capacity;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_118.field_2._8_8_;
  local_98.m_data.object.m_internal = (deUint64)local_118._M_dataplus._M_p;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)local_118._M_string_length;
  local_118._M_dataplus._M_p = (pointer)0x0;
  local_118._M_string_length = 0;
  local_118.field_2._M_allocated_capacity = 0;
  local_118.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_118);
  events.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  events.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  events.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar6 = 10;
  while (bVar1 = iVar6 != 0, iVar6 = iVar6 + -1, bVar1) {
    ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&local_68,vk,device,0,
                      (VkAllocationCallbacks *)0x0);
    ptr = (Unique<vk::Handle<(vk::HandleType)10>_> *)operator_new(0x20);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_device =
         local_68.m_data.deleter.m_device;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_allocator =
         local_68.m_data.deleter.m_allocator;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.object.m_internal =
         local_68.m_data.object.m_internal;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_deviceIface =
         local_68.m_data.deleter.m_deviceIface;
    local_68.m_data.object.m_internal = 0;
    local_68.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_68.m_data.deleter.m_device = (VkDevice)0x0;
    local_68.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> *)&local_118,ptr
              );
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>>
                *)&events,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> *)&local_118);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> *)&local_118);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_68);
  }
  std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
            (&cmdBuffers,10,(allocator_type *)&local_118);
  createCommadBuffers(vk,device,10,(VkCommandPool)local_98.m_data.object.m_internal,cmdBufferLevel,
                      cmdBuffers.
                      super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  local_78 = 0;
  local_70 = 0;
  do {
    uVar3 = local_70 / 3;
    uVar4 = local_70 % 3;
    if (local_70 == 300) {
      std::_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
      ~_Vector_base(&cmdBuffers.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                   );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"Pass",(allocator<char> *)&cmdBuffers);
      tcu::TestStatus::pass(local_120,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
LAB_004ab28e:
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
      ::~vector(&events);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_98);
      return local_120;
    }
    addCommandsToBuffer(vk,&cmdBuffers,&events);
    if ((ushort)((ushort)local_70 % 10) == 0) {
      std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
                (&cmdBuffersPeak,100,(allocator_type *)&local_118);
      createCommadBuffers(vk,device,
                          (deUint32)
                          ((ulong)((long)cmdBuffersPeak.
                                         super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)cmdBuffersPeak.
                                        super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3),
                          (VkCommandPool)local_98.m_data.object.m_internal,cmdBufferLevel,
                          cmdBuffersPeak.
                          super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      addCommandsToBuffer(vk,&cmdBuffersPeak,&events);
      if (cmdBufferLevel != VK_COMMAND_BUFFER_LEVEL_PRIMARY) {
        if (cmdBufferLevel == VK_COMMAND_BUFFER_LEVEL_SECONDARY) {
          bVar1 = executeSecondaryCmdBuffer
                            (local_f0,(VkCommandPool)local_98.m_data.object.m_internal,
                             &cmdBuffersPeak,&events);
          if (!bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_118,"Fail",&local_121);
            tcu::TestStatus::fail(local_120,&local_118);
            goto LAB_004ab270;
          }
        }
LAB_004ab078:
        (*vk->_vptr_DeviceInterface[0x48])
                  (vk,device,local_98.m_data.object.m_internal,
                   (ulong)((long)cmdBuffersPeak.
                                 super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)cmdBuffersPeak.
                                super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
        std::_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
        ~_Vector_base(&cmdBuffersPeak.
                       super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                     );
        goto LAB_004ab0ab;
      }
      bVar1 = submitAndCheck(local_f0,&cmdBuffersPeak,&events);
      if (bVar1) goto LAB_004ab078;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"Fail",&local_121);
      tcu::TestStatus::fail(local_120,&local_118);
LAB_004ab270:
      std::__cxx11::string::~string((string *)&local_118);
      std::_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
      ~_Vector_base(&cmdBuffersPeak.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                   );
LAB_004ab284:
      std::_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
      ~_Vector_base(&cmdBuffers.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                   );
      goto LAB_004ab28e;
    }
LAB_004ab0ab:
    (*vk->_vptr_DeviceInterface[0x7e])(vk,device,local_98.m_data.object.m_internal,0);
    lVar5 = local_78 + uVar3 * -0x18;
    if (cmdBufferLevel == VK_COMMAND_BUFFER_LEVEL_SECONDARY) {
      bVar1 = executeSecondaryCmdBuffer
                        (local_f0,(VkCommandPool)local_98.m_data.object.m_internal,&cmdBuffers,
                         &events);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"Fail",(allocator<char> *)&cmdBuffersPeak);
        tcu::TestStatus::fail(local_120,&local_118);
LAB_004ab218:
        std::__cxx11::string::~string((string *)&local_118);
        goto LAB_004ab284;
      }
    }
    else if (cmdBufferLevel == VK_COMMAND_BUFFER_LEVEL_PRIMARY) {
      bVar1 = submitAndCheck(local_f0,&cmdBuffers,&events);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"Fail",(allocator<char> *)&cmdBuffersPeak);
        tcu::TestStatus::fail(local_120,&local_118);
        goto LAB_004ab218;
      }
    }
    for (; uVar4 < 10; uVar4 = uVar4 + 2) {
      (*vk->_vptr_DeviceInterface[0x48])
                (vk,device,local_98.m_data.object.m_internal,1,
                 (long)cmdBuffers.
                       super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5);
      createCommadBuffers(vk,device,1,(VkCommandPool)local_98.m_data.object.m_internal,
                          cmdBufferLevel,
                          (VkCommandBuffer *)
                          ((long)cmdBuffers.
                                 super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + 0x10;
    }
    local_70 = local_70 + 1;
    local_78 = local_78 + 8;
  } while( true );
}

Assistant:

tcu::TestStatus trimCommandPoolTest (Context& context, const VkCommandBufferLevel cmdBufferLevel)
{
	if (!de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1"))
		TCU_THROW(NotSupportedError, "Extension VK_KHR_maintenance1 not supported");

	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	//test parameters
	const deUint32							cmdBufferIterationCount	= 300u;
	const deUint32							cmdBufferCount			= 10u;

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	std::vector <VkEventShared>				events;
	for (deUint32 ndx = 0u; ndx < cmdBufferCount; ++ndx)
		events.push_back(makeSharedPtr(createEvent(vk, vkDevice)));

	{
		std::vector<VkCommandBuffer> cmdBuffers(cmdBufferCount);
		createCommadBuffers(vk, vkDevice, cmdBufferCount, *cmdPool, cmdBufferLevel, &cmdBuffers[0]);

		for (deUint32 cmdBufferIterationrNdx = 0; cmdBufferIterationrNdx < cmdBufferIterationCount; ++cmdBufferIterationrNdx)
		{
			addCommandsToBuffer(vk, cmdBuffers, events);

			//Peak, situation when we use a lot more command buffers
			if (cmdBufferIterationrNdx % 10u == 0)
			{
				std::vector<VkCommandBuffer> cmdBuffersPeak(cmdBufferCount * 10u);
				createCommadBuffers(vk, vkDevice, static_cast<deUint32>(cmdBuffersPeak.size()), *cmdPool, cmdBufferLevel, &cmdBuffersPeak[0]);
				addCommandsToBuffer(vk, cmdBuffersPeak, events);

				switch(cmdBufferLevel)
				{
					case VK_COMMAND_BUFFER_LEVEL_PRIMARY:
						if (!submitAndCheck(context, cmdBuffersPeak, events))
							return tcu::TestStatus::fail("Fail");
						break;
					case VK_COMMAND_BUFFER_LEVEL_SECONDARY:
						if (!executeSecondaryCmdBuffer(context, *cmdPool, cmdBuffersPeak, events))
							return tcu::TestStatus::fail("Fail");
						break;
					default:
						DE_ASSERT(0);
				}
				vk.freeCommandBuffers(vkDevice, *cmdPool, static_cast<deUint32>(cmdBuffersPeak.size()), &cmdBuffersPeak[0]);
			}

			vk.trimCommandPoolKHR(vkDevice, *cmdPool, (VkCommandPoolTrimFlagsKHR)0);

			switch(cmdBufferLevel)
			{
				case VK_COMMAND_BUFFER_LEVEL_PRIMARY:
					if (!submitAndCheck(context, cmdBuffers, events))
						return tcu::TestStatus::fail("Fail");
					break;
				case VK_COMMAND_BUFFER_LEVEL_SECONDARY:
					if (!executeSecondaryCmdBuffer(context, *cmdPool, cmdBuffers, events))
						return tcu::TestStatus::fail("Fail");
					break;
				default:
					DE_ASSERT(0);
			}

			for (deUint32 bufferNdx = cmdBufferIterationrNdx % 3u; bufferNdx < cmdBufferCount; bufferNdx+=2u)
			{
				vk.freeCommandBuffers(vkDevice, *cmdPool, 1u, &cmdBuffers[bufferNdx]);
				createCommadBuffers(vk, vkDevice, 1u, *cmdPool, cmdBufferLevel, &cmdBuffers[bufferNdx]);
			}
		}
	}

	return tcu::TestStatus::pass("Pass");
}